

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void __thiscall
duckdb::BitpackingCompressionState<short,_true,_short>::Append
          (BitpackingCompressionState<short,_true,_short> *this,UnifiedVectorFormat *vdata,
          idx_t count)

{
  short value;
  data_ptr_t pdVar1;
  sel_t *psVar2;
  bool is_valid;
  idx_t i;
  idx_t iVar3;
  idx_t row_idx;
  
  pdVar1 = vdata->data;
  for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
    psVar2 = vdata->sel->sel_vector;
    row_idx = iVar3;
    if (psVar2 != (sel_t *)0x0) {
      row_idx = (idx_t)psVar2[iVar3];
    }
    value = *(short *)(pdVar1 + row_idx * 2);
    is_valid = TemplatedValidityMask<unsigned_long>::RowIsValid
                         (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
    BitpackingState<short,short>::
    Update<duckdb::BitpackingCompressionState<short,true,short>::BitpackingWriter>
              ((BitpackingState<short,short> *)&this->state,value,is_valid);
  }
  return;
}

Assistant:

void Append(UnifiedVectorFormat &vdata, idx_t count) {
		auto data = UnifiedVectorFormat::GetData<T>(vdata);

		for (idx_t i = 0; i < count; i++) {
			idx_t idx = vdata.sel->get_index(i);
			state.template Update<BitpackingCompressionState<T, WRITE_STATISTICS, T_S>::BitpackingWriter>(
			    data[idx], vdata.validity.RowIsValid(idx));
		}
	}